

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  byte *pbVar1;
  int iVar2;
  void *pvVar3;
  uint64_t uVar4;
  code *pcVar5;
  TValue *top;
  TValue *top_00;
  ulong uVar6;
  void **ppvVar7;
  TValue *pTVar8;
  uint uVar9;
  
  pTVar8 = L->base + -1;
  ppvVar7 = &L->cframe;
LAB_0010980e:
  pvVar3 = *ppvVar7;
LAB_00109818:
  do {
    if (pvVar3 == (void *)0x0) {
LAB_00109898:
      if (errcode != 0) {
        pTVar8 = (TValue *)((L->stack).ptr64 + 0x10);
        L->base = pTVar8;
        L->cframe = (void *)0x0;
        unwindstack(L,pTVar8);
        pcVar5 = *(code **)((L->glref).ptr64 + 0x160);
        if (pcVar5 != (code *)0x0) {
          (*pcVar5)(L);
        }
        exit(1);
      }
      return L;
    }
    iVar2 = *(int *)(((ulong)pvVar3 & 0xfffffffffffffffc) + 8);
    uVar4 = (L->stack).ptr64;
    if ((iVar2 < 0) && (top_00 = (TValue *)((uint)-iVar2 + uVar4), pTVar8 < top_00)) {
      if (errcode == 0) {
        return pvVar3;
      }
      L->base = pTVar8 + 1;
      L->cframe = *(void **)((long)pvVar3 + 0x20);
LAB_001098bf:
      unwindstack(L,top_00);
      return pvVar3;
    }
    if (pTVar8 <= (TValue *)(uVar4 + 8)) goto LAB_00109898;
    uVar6 = pTVar8->u64;
    uVar9 = (uint)uVar6 & 7;
    switch(uVar9) {
    default:
      pTVar8 = pTVar8 + (-2 - (ulong)*(byte *)(uVar6 - 3));
      goto LAB_00109818;
    case 1:
      goto switchD_0010984d_caseD_1;
    case 2:
      if (pTVar8[-3].u64 == 1) goto switchD_0010984d_caseD_1;
      break;
    case 3:
      break;
    case 5:
      if (((ulong)pvVar3 & 1) != 0) {
        if (errcode != 0) {
          pbVar1 = (byte *)((L->glref).ptr64 + 0x91);
          *pbVar1 = *pbVar1 & 0xef;
          L->cframe = (void *)0x0;
          L->status = (uint8_t)errcode;
          return pvVar3;
        }
        return pvVar3;
      }
      if (errcode == 0) {
        return pvVar3;
      }
      L->base = (TValue *)((long)pTVar8 + (8 - (uVar6 & 0xfffffffffffffff8)));
      L->cframe = *(void **)((long)pvVar3 + 0x20);
      top_00 = pTVar8 + -1;
      goto LAB_001098bf;
    case 6:
    case 7:
      if (errcode != 1) {
        if (errcode != 0) {
          if (uVar9 == 6) {
            pbVar1 = (byte *)((L->glref).ptr64 + 0x91);
            *pbVar1 = *pbVar1 & 0xef;
            uVar6 = pTVar8->u64;
          }
          pTVar8 = (TValue *)((long)pTVar8 + (8 - (uVar6 & 0xfffffffffffffff8)));
          L->base = pTVar8;
          L->cframe = pvVar3;
          unwindstack(L,pTVar8);
        }
        return (void *)((ulong)pvVar3 | 2);
      }
    }
    pTVar8 = (TValue *)((long)pTVar8 - (uVar6 & 0xfffffffffffffff8));
  } while( true );
switchD_0010984d_caseD_1:
  if (errcode != 0) {
    L->base = (TValue *)((long)pTVar8 + (8 - (uVar6 & 0xfffffffffffffff8)));
    L->cframe = *(void **)((long)pvVar3 + 0x20);
    unwindstack(L,pTVar8 + -1);
    return (void *)0x0;
  }
  if (pvVar3 == stopcf) {
    return (void *)0x0;
  }
  ppvVar7 = (void **)((long)pvVar3 + 0x20);
  pTVar8 = (TValue *)((long)pTVar8 - (uVar6 & 0xfffffffffffffff8));
  goto LAB_0010980e;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->base = frame+1;
	  L->cframe = cframe_prev(cf);
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack)+LJ_FR2)
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
    unwind_c:
#if LJ_UNWIND_EXT
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
      if (frame_iscont_fficb(frame))
	goto unwind_c;
      /* fallthrough */
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(G(L));
	L->base = frame_prevd(frame) + 1;
	L->cframe = cf;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->base = tvref(L->stack)+1+LJ_FR2;
    L->cframe = NULL;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}